

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong size;
  ulong uVar10;
  ulong uVar11;
  char *__format;
  long lVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  ulong local_78;
  ulong local_60;
  int local_50;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "_s2";
  }
  else {
    local_60 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar8 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar8 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        local_78 = (ulong)(uint)matrix->length;
LAB_004f5a2c:
        iVar13 = (int)local_78;
        ppVar3 = parasail_result_new_table1(iVar13,s2Len);
        if (ppVar3 != (parasail_result_t *)0x0) {
          ppVar3->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                         (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar3->flag |
                         0x1420202;
          size = (ulong)(uint)s2Len;
          ptr = parasail_memalign_int(0x10,size);
          ptr_00 = parasail_memalign_int(0x10,(long)(iVar13 + 1));
          ptr_01 = parasail_memalign_int(0x10,(long)iVar13);
          ptr_02 = parasail_memalign_int(0x10,(long)(iVar13 + 1));
          auVar15._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
          auVar15._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
          auVar15._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
          auVar15._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
          iVar2 = movmskps((int)ptr_02,auVar15);
          if (iVar2 == 0) {
            if (matrix->type == 0) {
              ptr_03 = parasail_memalign_int(0x10,(long)iVar13);
              uVar6 = 0;
              if (ptr_03 == (int *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar7 = 0;
              if (0 < iVar13) {
                uVar7 = local_78;
              }
              for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                ptr_03[uVar6] = matrix->mapper[(byte)_s1[uVar6]];
              }
            }
            else {
              ptr_03 = (int *)0x0;
            }
            piVar1 = matrix->mapper;
            for (uVar6 = 0; size != uVar6; uVar6 = uVar6 + 1) {
              ptr[uVar6] = piVar1[(byte)_s2[uVar6]];
            }
            *ptr_00 = 0;
            *ptr_02 = 0;
            uVar6 = 0;
            if (0 < iVar13) {
              uVar6 = local_78;
            }
            if (s1_beg == 0) {
              iVar2 = -open;
              for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
                ptr_00[uVar7 + 1] = iVar2;
                iVar2 = iVar2 - gap;
              }
            }
            else {
              for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
                ptr_00[uVar7 + 1] = 0;
              }
            }
            for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
              ptr_01[uVar7] = -0x40000000;
            }
            uVar4 = s2Len - 1;
            uVar7 = (ulong)uVar4;
            uVar5 = iVar13 - 1;
            local_50 = -0x40000000;
            for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
              for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
                iVar13 = ptr_00[uVar10 + 1] - open;
                if (ptr_00[uVar10 + 1] - open < ptr_01[uVar10] - gap) {
                  iVar13 = ptr_01[uVar10] - gap;
                }
                ptr_01[uVar10] = iVar13;
              }
              for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
                if (matrix->type == 0) {
                  iVar13 = ptr_03[uVar10];
                }
                else {
                  iVar13 = (int)uVar10;
                }
                iVar13 = ptr_00[uVar10] +
                         matrix->matrix[(long)(matrix->size * iVar13) + (long)ptr[uVar9]];
                if (iVar13 <= ptr_01[uVar10]) {
                  iVar13 = ptr_01[uVar10];
                }
                ptr_02[uVar10 + 1] = iVar13;
              }
              iVar13 = -((int)uVar9 * gap + open);
              if (s2_beg != 0) {
                iVar13 = 0;
              }
              *ptr_02 = iVar13;
              iVar2 = -0x40000000;
              uVar10 = uVar9;
              for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
                iVar2 = iVar2 - gap;
                if (iVar2 < ptr_02[uVar11]) {
                  iVar2 = ptr_02[uVar11];
                }
                iVar14 = iVar2 - open;
                if (iVar2 - open < ptr_02[uVar11 + 1]) {
                  iVar14 = ptr_02[uVar11 + 1];
                }
                ptr_00[uVar11 + 1] = iVar14;
                ((ppVar3->field_4).rowcols)->score_row[uVar10] = iVar14;
                uVar10 = uVar10 + size;
              }
              *ptr_00 = iVar13;
              if ((s2_end != 0) && (local_50 < ptr_00[(long)(int)uVar5 + 1])) {
                local_78 = (ulong)uVar5;
                local_60 = uVar9 & 0xffffffff;
                local_50 = ptr_00[(long)(int)uVar5 + 1];
              }
            }
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              iVar13 = ptr_00[uVar9 + 1] - open;
              if (ptr_00[uVar9 + 1] - open < ptr_01[uVar9] - gap) {
                iVar13 = ptr_01[uVar9] - gap;
              }
              ptr_01[uVar9] = iVar13;
            }
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              if (matrix->type == 0) {
                iVar13 = ptr_03[uVar9];
              }
              else {
                iVar13 = (int)uVar9;
              }
              iVar13 = ptr_00[uVar9] +
                       matrix->matrix[(long)(matrix->size * iVar13) + (long)ptr[uVar7]];
              if (iVar13 <= ptr_01[uVar9]) {
                iVar13 = ptr_01[uVar9];
              }
              ptr_02[uVar9 + 1] = iVar13;
            }
            iVar13 = -(uVar4 * gap + open);
            uVar9 = 0;
            if (s2_beg != 0) {
              iVar13 = 0;
            }
            *ptr_02 = iVar13;
            lVar12 = (long)(int)uVar4;
            iVar13 = -0x40000000;
            while( true ) {
              if (uVar6 == uVar9) break;
              iVar13 = iVar13 - gap;
              if (iVar13 < ptr_02[uVar9]) {
                iVar13 = ptr_02[uVar9];
              }
              iVar2 = iVar13 - open;
              if (iVar13 - open < ptr_02[uVar9 + 1]) {
                iVar2 = ptr_02[uVar9 + 1];
              }
              ptr_00[uVar9 + 1] = iVar2;
              ((ppVar3->field_4).rowcols)->score_row[lVar12] = iVar2;
              if ((s1_end != 0) && (local_50 < ptr_00[uVar9 + 1])) {
                local_78 = uVar9 & 0xffffffff;
                local_50 = ptr_00[uVar9 + 1];
                local_60 = uVar7;
              }
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 + size;
            }
            if ((s2_end != 0) && (local_50 < ptr_00[(long)(int)uVar5 + 1])) {
              local_50 = ptr_00[(long)(int)uVar5 + 1];
              local_78._0_4_ = uVar5;
              local_60._0_4_ = uVar4;
            }
            if (s2_end == 0 && s1_end == 0) {
              local_50 = ptr_00[(long)(int)uVar5 + 1];
              local_78._0_4_ = uVar5;
              local_60._0_4_ = uVar4;
            }
            ppVar3->score = local_50;
            ppVar3->end_query = (uint)local_78;
            ppVar3->end_ref = (uint)local_60;
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_03);
              return ppVar3;
            }
            return ppVar3;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar8 = "_s1";
      }
      else {
        local_78 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_004f5a2c;
        __format = "%s: %s must be > 0\n";
        pcVar8 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan",pcVar8);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}